

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::XFormWidget::drag
          (XFormWidget *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  Axis AVar1;
  Mode MVar2;
  SceneObject *pSVar3;
  HalfedgeElement *this_00;
  _List_node_base *p_Var4;
  uint uVar5;
  Vertex *pVVar6;
  Edge *pEVar7;
  Face *pFVar8;
  ulong uVar9;
  Vector3D *unaff_R13;
  _List_node_base *p_Var10;
  bool bVar11;
  double dVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  double w;
  vector<int,_std::allocator<int>_> I;
  double dStack_240;
  _Vector_base<int,_std::allocator<int>_> local_1d8;
  _Vector_base<int,_std::allocator<int>_> local_1c0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  Vector3D local_198;
  Vector3D local_178;
  int view [4];
  double winZ;
  double local_130;
  _Vector_base<int,_std::allocator<int>_> local_128;
  _Vector_base<int,_std::allocator<int>_> local_110;
  Vector3D local_f8;
  Vector3D local_d8;
  double proj [16];
  
  AVar1 = (this->target).axis;
  pSVar3 = (this->target).object;
  if (pSVar3 == (SceneObject *)0x0 || AVar1 == None) {
    return;
  }
  this_00 = (this->target).element;
  if ((this_00 == (HalfedgeElement *)0x0) && ((this->objectMode & 1U) == 0)) {
    return;
  }
  MVar2 = this->mode;
  if ((this->objectMode & 1U) == 0) {
    if (AVar1 == Center && MVar2 == Translate) {
      (*this_00->_vptr_HalfedgeElement[4])(this_00,modelViewProj);
      return;
    }
    pVVar6 = HalfedgeElement::getVertex(this_00);
    pEVar7 = HalfedgeElement::getEdge((this->target).element);
    pFVar8 = HalfedgeElement::getFace((this->target).element);
    (**((this->target).element)->_vptr_HalfedgeElement)(&I);
    (this->center).z =
         (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
    (this->center).x =
         (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start;
    (this->center).y =
         (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish;
    proj._0_12_ = ZEXT812(0);
    __l._M_len = 3;
    __l._M_array = (iterator)proj;
    std::vector<int,_std::allocator<int>_>::vector(&I,__l,(allocator_type *)view);
    switch((this->target).axis) {
    case X:
      break;
    case Y:
      I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           + 1;
      break;
    case Z:
      I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
           I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           + 2;
      break;
    case Center:
      I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1] =
           1;
      I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[2] =
           1;
      break;
    default:
      goto switchD_0018118b_default;
    }
    *I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
switchD_0018118b_default:
    if (pVVar6 == (Vertex *)0x0) {
      if (pEVar7 == (Edge *)0x0) {
        if (pFVar8 != (Face *)0x0) {
          p_Var10 = (pFVar8->_halfedge)._M_node;
          do {
            p_Var4 = p_Var10[2]._M_prev;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)&local_128,&I);
            local_198.x = (this->center).x;
            local_198.y = (this->center).y;
            local_198.z = (this->center).z;
            directionalTransform
                      (this,(Vector3D *)&p_Var4[1]._M_prev,
                       (vector<int,_std::allocator<int>_> *)&local_128,&local_198,x,y,dx,dy,
                       modelViewProj);
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_128);
            p_Var10 = p_Var10[2]._M_next;
          } while ((pFVar8->_halfedge)._M_node != p_Var10);
        }
      }
      else {
        p_Var10 = (pEVar7->_halfedge)._M_node;
        do {
          p_Var4 = p_Var10[2]._M_prev;
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&local_110,&I);
          local_178.x = (this->center).x;
          local_178.y = (this->center).y;
          local_178.z = (this->center).z;
          directionalTransform
                    (this,(Vector3D *)&p_Var4[1]._M_prev,
                     (vector<int,_std::allocator<int>_> *)&local_110,&local_178,x,y,dx,dy,
                     modelViewProj);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_110);
          p_Var10 = p_Var10[1]._M_prev;
        } while ((pEVar7->_halfedge)._M_node != p_Var10);
      }
    }
    else {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_1d8,&I);
      local_f8.x = (this->center).x;
      local_f8.y = (this->center).y;
      local_f8.z = (this->center).z;
      directionalTransform
                (this,&pVVar6->position,(vector<int,_std::allocator<int>_> *)&local_1d8,&local_f8,x,
                 y,dx,dy,modelViewProj);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1d8);
    }
    (this->clickPosition).x = x;
    (this->clickPosition).y = y;
    goto LAB_00181586;
  }
  if (MVar2 == Scale) {
    unaff_R13 = &pSVar3->scale;
  }
  else {
    if (MVar2 == Rotate) {
      glGetDoublev(0xba6,&I);
      glGetDoublev(0xba7,proj);
      glGetIntegerv(0xba2,view);
      gluProject((this->center).x,SUB84((this->center).y,0),SUB84((this->center).z,0),&I,proj,view,
                 &w,&local_130,&winZ);
      dVar12 = atan2(((double)view[3] - local_130) - y,x - w);
      uVar9 = (ulong)(this->target).axis;
      if (2 < uVar9) {
        return;
      }
      (&(pSVar3->rotation).x)[uVar9] = (dVar12 / 3.141592653589793) * 180.0;
      return;
    }
    if ((MVar2 == Translate) && (unaff_R13 = &pSVar3->position, AVar1 == Center)) {
      proj[0] = (pSVar3->position).x;
      proj[1] = (pSVar3->position).y;
      proj[2] = (pSVar3->position).z;
      proj[3] = 1.0;
      Matrix4x4::operator*(modelViewProj,(Vector4D *)proj);
      proj[2] = (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
      proj[3] = dStack_240;
      proj[0] = (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
      proj[1] = (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish;
      w = dStack_240;
      Vector4D::operator/=((Vector4D *)proj,&w);
      dVar12 = (dy + proj[1]) * w;
      proj[1]._0_4_ = SUB84(dVar12,0);
      proj[0] = (dx + proj[0]) * w;
      proj[1]._4_4_ = (int)((ulong)dVar12 >> 0x20);
      proj[2] = w * proj[2];
      proj[3] = w * proj[3];
      Matrix4x4::inv((Matrix4x4 *)&I,modelViewProj);
      Matrix4x4::operator*((Matrix4x4 *)&I,(Vector4D *)proj);
      Vector4D::to3D((Vector4D *)proj);
      (pSVar3->position).z =
           (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_end_of_storage;
      unaff_R13->x = (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start;
      (pSVar3->position).y =
           (double)I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
      return;
    }
  }
  proj._0_12_ = ZEXT812(0);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)proj;
  std::vector<int,_std::allocator<int>_>::vector(&I,__l_00,(allocator_type *)view);
  switch((this->target).axis) {
  case X:
    break;
  case Y:
    I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
         1;
    break;
  case Z:
    I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start +
         2;
    break;
  case Center:
    I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[1] = 1;
    I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start[2] = 1;
    break;
  default:
    goto switchD_001812a8_default;
  }
  *I.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start = 1;
switchD_001812a8_default:
  MVar2 = this->mode;
  local_1a8 = (this->center).x;
  uStack_1a0 = (this->center).y;
  dVar12 = (this->center).z;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&local_1c0,&I)
  ;
  bVar11 = MVar2 == Translate;
  uVar13 = SUB84(dVar12,0);
  uVar14 = (undefined4)((ulong)dVar12 >> 0x20);
  if (!bVar11) {
    uVar13 = 0;
    uVar14 = 0;
  }
  uVar5 = (uint)bVar11;
  local_d8.x._0_4_ = (int)(uVar5 << 0x1f) >> 0x1f & (uint)local_1a8;
  local_d8.x._4_4_ = (int)(uVar5 << 0x1f) >> 0x1f & local_1a8._4_4_;
  local_d8.y._0_4_ = (int)(uVar5 << 0x1f) >> 0x1f & (uint)uStack_1a0;
  local_d8.y._4_4_ = (int)(uVar5 << 0x1f) >> 0x1f & uStack_1a0._4_4_;
  local_d8.z = (double)CONCAT44(uVar14,uVar13);
  directionalTransform
            (this,unaff_R13,(vector<int,_std::allocator<int>_> *)&local_1c0,&local_d8,x,y,dx,dy,
             modelViewProj);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_1c0);
LAB_00181586:
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&I.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void XFormWidget::drag( double x, double y, double dx, double dy, const Matrix4x4& modelViewProj )
{
  if (target.axis == Selection::Axis::None) return;
  if (target.object == nullptr) return;
  if (target.element == nullptr && !objectMode) return;

  if (objectMode) {
    Vector3D *update;
    switch (mode) {
      case Mode::Translate:
        update = &target.object->position;
        break;
      case Mode::Scale:
        update = &target.object->scale;
        break;
      case Mode::Rotate:
        update = &target.object->rotation;
        break;
    }

    if (mode == Mode::Rotate) {
      double winX, winY, winZ;
      double model[16], proj[16];
      int view[4];
      glGetDoublev(GL_MODELVIEW_MATRIX, model);
      glGetDoublev(GL_PROJECTION_MATRIX, proj);
      glGetIntegerv(GL_VIEWPORT, view);
      gluProject(center.x, center.y, center.z, model, proj, view, &winX, &winY, &winZ);
      winY = view[3] - winY;
      double theta = atan2(winY - y, x - winX) / PI * 180;
      switch (target.axis) {
        case Selection::Axis::X:
          update->x = theta;
          break;
        case Selection::Axis::Y:
          update->y = theta;
          break;
        case Selection::Axis::Z:
          update->z = theta;
          break;
        }
    }
    else if (mode == Mode::Translate &&
        target.axis == Selection::Axis::Center) {        
      Vector4D q( *update, 1. );
      q = modelViewProj * q; 
      double w = q.w;
      q /= w;
      // Shift by (dx, dy).
      q.x += dx;
      q.y += dy;
      // Transform back into model s*updateace
      q *= w;
      q = modelViewProj.inv() * q;
      *update = q.to3D();
    }
    else
    {
      vector<int> I = { 0, 0, 0 };
      switch (target.axis)
      {
      case Selection::Axis::X:
        I[0] = 1;
        break;
      case Selection::Axis::Y:
        I[1] = 1;
        break;
      case Selection::Axis::Z:
        I[2] = 1;
        break;
      case Selection::Axis::Center:
        I[0] = I[1] = I[2] = 1;
        break;
      default:
        break;
      }
      Vector3D c = mode == Mode::Translate ? center : Vector3D(0, 0, 0);
      directionalTransform(*update, I, c, x, y, dx, dy, modelViewProj);
    }

    return;
  }

   if( mode == Mode::Translate &&
       target.axis == Selection::Axis::Center )
   {
      target.element->translate( dx, dy, modelViewProj );
      // TODO uniform scale, free rotate
      return;
   }

   Vertex* v = target.element->getVertex();
   Edge*   e = target.element->getEdge();
   Face*   f = target.element->getFace();

   center = target.element->centroid();

   vector<int> I = { 0, 0, 0 };
   switch( target.axis )
   {
      case Selection::Axis::X:
         I[0] = 1;
         break;
      case Selection::Axis::Y:
         I[1] = 1;
         break;
      case Selection::Axis::Z:
         I[2] = 1;
         break;
      case Selection::Axis::Center:
         I[0] = I[1] = I[2] = 1;
         break;
      default:
         break;
   }

   if( v )
   {
      directionalTransform( v->position, I, center, x, y, dx, dy, modelViewProj );
   }
   else if( e )
   {
      HalfedgeIter h = e->halfedge();
      do
      {
         directionalTransform( h->vertex()->position, I, center, x, y, dx, dy, modelViewProj );
         h = h->twin();
      }
      while( h != e->halfedge() );
   }
   else if( f )
   {
      HalfedgeIter h = f->halfedge();
      do
      {
         directionalTransform( h->vertex()->position, I, center, x, y, dx, dy, modelViewProj );
         h = h->next();
      }
      while( h != f->halfedge() );
   }

   clickPosition = Vector2D(x,y);
}